

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall Alg::opim(Alg *this,int targetSize,size_t numRRsets,double delta,int mode)

{
  size_t sVar1;
  TResult *pTVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  double dVar7;
  double dVar8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  char local_89;
  double local_88;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  local_78 = delta;
  local_88 = (double)std::chrono::_V2::system_clock::now();
  local_68 = 2.0 / local_78;
  local_78 = log(local_68);
  local_58 = log(local_68);
  HyperGraph::build_n_RRsets(&this->__hyperG,numRRsets >> 1);
  HyperGraph::build_n_RRsets(&this->__hyperGVldt,numRRsets >> 1);
  this->__numRRsets = (this->__hyperG).__numRRsets;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_68 = max_cover(this,targetSize,mode);
  lVar4 = std::chrono::_V2::system_clock::now();
  dVar7 = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
  dVar8 = local_88;
  sVar1 = this->__numRRsets;
  if (mode == 1) {
    local_50 = this->__boundLast;
  }
  else if (mode == 2) {
    local_50 = this->__boundMin;
  }
  else {
    local_50 = local_68 / 0.6321205588285577;
  }
  auVar12._8_4_ = (int)(sVar1 >> 0x20);
  auVar12._0_8_ = sVar1;
  auVar12._12_4_ = 0x45300000;
  dVar10 = (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  local_88 = (double)this->__numV;
  dVar13 = local_50 * dVar10;
  auVar11._0_8_ = local_78 * 2.0;
  auVar11._8_8_ = dVar10 * dVar7;
  auVar9._8_8_ = local_88;
  auVar9._0_8_ = 0x4022000000000000;
  auVar12 = divpd(auVar11,auVar9);
  dVar10 = auVar12._8_8_ + auVar12._0_8_;
  local_48._8_4_ = (int)extraout_XMM0_Qb;
  local_48._0_8_ = dVar7;
  local_48._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (dVar10 < 0.0) {
    dVar7 = sqrt(dVar10);
    dVar10 = local_88;
  }
  else {
    dVar7 = SQRT(dVar10);
    dVar10 = local_88;
  }
  local_88 = dVar7;
  dVar7 = local_78 * 0.5;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  local_60 = (double)(lVar3 - (long)dVar8);
  local_88 = (local_88 - dVar7) * (local_88 - dVar7);
  dVar7 = local_58 * 0.5;
  dVar10 = dVar13 / dVar10 + dVar7;
  if (dVar10 < 0.0) {
    local_78 = local_78 / -18.0;
    local_58 = dVar7;
    dVar10 = sqrt(dVar10);
    dVar13 = local_78;
    dVar7 = local_58;
  }
  else {
    dVar10 = SQRT(dVar10);
    dVar13 = local_78 / -18.0;
  }
  local_60 = local_60 / 1000000000.0;
  local_88 = local_88 + dVar13;
  if (dVar7 < 0.0) {
    local_78 = dVar10;
    dVar7 = sqrt(dVar7);
    dVar10 = local_78;
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  local_88 = local_88 / ((dVar10 + dVar7) * (dVar10 + dVar7));
  pTVar2 = this->__tRes;
  pTVar2->__Approx = local_88;
  lVar5 = std::chrono::_V2::system_clock::now();
  pTVar2->__RunningTime = (double)(lVar5 - (long)dVar8) / 1000000000.0;
  pTVar2 = this->__tRes;
  pTVar2->__Influence = (double)local_48._0_8_;
  pTVar2->__InfluenceOriginal = local_68;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&pTVar2->__VecSeed,&this->__vecSeed);
  pTVar2->__SeedSize =
       (int)((ulong)((long)(this->__vecSeed).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->__vecSeed).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  this->__tRes->__RRsetsSize = this->__numRRsets * 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>OPIM approx. (max-cover): ",0x1d);
  poVar6 = std::ostream::_M_insert<double>(local_88);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
  poVar6 = std::ostream::_M_insert<double>(local_68 / local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"==>Time for RR sets and greedy: ",0x20);
  poVar6 = std::ostream::_M_insert<double>(local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
  poVar6 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  local_89 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_89,1);
  pTVar2 = this->__tRes;
  dVar8 = effic_inf_valid_algo(this);
  pTVar2->__Influence = dVar8;
  return local_88;
}

Assistant:

double Alg::opim(const int targetSize, const size_t numRRsets, const double delta, const int mode)
{
    Timer timerOPIM("OPIM");
    const double e = exp(1);
    const double approx = 1 - 1.0 / e;
    const double a1 = log(2.0 / delta);
    const double a2 = log(2.0 / delta);
    __hyperG.build_n_RRsets(numRRsets / 2); // R1
    __hyperGVldt.build_n_RRsets(numRRsets / 2); // R2
    __numRRsets = __hyperG.get_RR_sets_size();
    const auto time1 = timerOPIM.get_operation_time();
    const auto infSelf = max_cover(targetSize, mode);
    const auto time2 = timerOPIM.get_operation_time();
    const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
    const auto degVldt = infVldt * __numRRsets / __numV;
    auto upperBound = infSelf / approx;
    if (mode == 1) upperBound = __boundLast;
    else if (mode == 2) upperBound = __boundMin;
    const auto upperDegOPT = upperBound * __numRRsets / __numV;
    const auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
    const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
    const auto approxOPIM = lowerSelect / upperOPT;
    //guaranteeOpt = opt_error(degVldt, degSelfUpper, delta);
    __tRes.set_approximation(approxOPIM);
    __tRes.set_running_time(timerOPIM.get_total_time());
    __tRes.set_influence(infVldt);
    __tRes.set_influence_original(infSelf);
    __tRes.set_seed_vec(__vecSeed);
    __tRes.set_RR_sets_size(__numRRsets * 2);
    std::cout << "==>OPIM approx. (max-cover): " << approxOPIM << " (" << infSelf / upperBound << ")\n";
    std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 << '\n';
    __tRes.set_influence(effic_inf_valid_algo());
    return approxOPIM;
}